

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ODDataBarReader.cpp
# Opt level: O3

int ZXing::OneD::ParseFinderPattern(PatternView *view,bool reversed)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  int iVar4;
  undefined7 in_register_00000031;
  value_type *pvVar5;
  value_type *pvVar6;
  array<ZXing::FixedPattern<5,_15,_false>,_10UL> *paVar7;
  array<ZXing::FixedPattern<5,_15,_false>,_10UL> aStack_d8;
  value_type local_70 [48];
  undefined4 local_10;
  
  pvVar5 = (value_type *)&ParseFinderPattern::REVERSED_FINDER_PATTERNS;
  pvVar6 = local_70;
  for (lVar3 = 0xc; lVar3 != 0; lVar3 = lVar3 + -1) {
    *(undefined8 *)pvVar6 = *(undefined8 *)pvVar5;
    pvVar5 = pvVar5 + 4;
    pvVar6 = pvVar6 + 4;
  }
  local_10 = 0;
  pvVar5 = (value_type *)&ParseFinderPattern::FINDER_PATTERNS;
  paVar7 = &aStack_d8;
  for (lVar3 = 0xc; lVar3 != 0; lVar3 = lVar3 + -1) {
    *(undefined8 *)paVar7 = *(undefined8 *)pvVar5;
    pvVar5 = pvVar5 + 4;
    paVar7 = (array<ZXing::FixedPattern<5,_15,_false>,_10UL> *)((long)paVar7 + 8);
  }
  aStack_d8._M_elems[9]._data[3] = 0;
  aStack_d8._M_elems[9]._data[4] = 0;
  iVar4 = (int)CONCAT71(in_register_00000031,reversed);
  pvVar5 = (value_type *)&aStack_d8;
  if (iVar4 != 0) {
    pvVar5 = local_70;
  }
  uVar1 = RowReader::
          DecodeDigit<ZXing::PatternView,std::array<ZXing::FixedPattern<5,15,false>,10ul>>
                    (view,(array<ZXing::FixedPattern<5,_15,_false>,_10UL> *)pvVar5,0.2,0.45,true);
  uVar2 = ~uVar1;
  if (iVar4 == 0) {
    uVar2 = uVar1 + 1;
  }
  return uVar2;
}

Assistant:

int ParseFinderPattern(const PatternView& view, bool reversed)
{
	static constexpr std::array<FixedPattern<5, 15>, 10> FINDER_PATTERNS = {{
		{3, 8, 2, 1, 1},
		{3, 5, 5, 1, 1},
		{3, 3, 7, 1, 1},
		{3, 1, 9, 1, 1},
		{2, 7, 4, 1, 1},
		{2, 5, 6, 1, 1},
		{2, 3, 8, 1, 1},
		{1, 5, 7, 1, 1},
		{1, 3, 9, 1, 1},
	}};

	// TODO: c++20 constexpr inversion from FIND_PATTERN?
	static constexpr std::array<FixedPattern<5, 15>, 10> REVERSED_FINDER_PATTERNS = {{
		{1, 1, 2, 8, 3}, {1, 1, 5, 5, 3}, {1, 1, 7, 3, 3}, {1, 1, 9, 1, 3}, {1, 1, 4, 7, 2},
		{1, 1, 6, 5, 2}, {1, 1, 8, 3, 2}, {1, 1, 7, 5, 1}, {1, 1, 9, 3, 1},
	}};

	return ParseFinderPattern(view, reversed, FINDER_PATTERNS, REVERSED_FINDER_PATTERNS);
}